

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# altrace_record.c
# Opt level: O0

void alGetIntegerv(ALenum param,ALint *values)

{
  uint local_20;
  uint local_1c;
  uint32 i;
  uint32 numvals;
  ALint *values_local;
  ALenum param_local;
  
  APILOCK();
  IO_ENTRYINFO(ALEE_alGetIntegerv);
  IO_ENUM(param);
  IO_PTR(values);
  local_1c = (uint)(param == 0xd000);
  if (values == (ALint *)0x0) {
    local_1c = 0;
  }
  if (local_1c != 0) {
    memset(values,0,(ulong)local_1c << 2);
  }
  (*REAL_alGetIntegerv)(param,values);
  IO_UINT32(local_1c);
  for (local_20 = 0; local_20 < local_1c; local_20 = local_20 + 1) {
    IO_INT32(values[local_20]);
  }
  check_al_error_events();
  check_al_async_states();
  APIUNLOCK();
  return;
}

Assistant:

void alGetIntegerv(ALenum param, ALint *values)
{
    uint32 numvals = 0;
    uint32 i;
    IO_START(alGetIntegerv);
    IO_ENUM(param);
    IO_PTR(values);

    switch (param) {
        case AL_DISTANCE_MODEL: numvals = 1;
        default: break;
    }
    if (!values) { numvals = 0; }
    if (numvals) {
        memset(values, '\0', numvals * sizeof (ALint));
    }
    REAL_alGetIntegerv(param, values);
    IO_UINT32(numvals);
    for (i = 0; i < numvals; i++) {
        IO_INT32(values[i]);
    }
    IO_END();
}